

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::forward
          (DeconvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  _func_int *p_Var10;
  int *piVar11;
  void *pvVar12;
  Layer *pLVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  Mat *pMVar27;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  _func_int *p_Var36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  float *pfVar40;
  int iVar41;
  int iVar42;
  size_t sVar43;
  int iVar44;
  undefined1 (*pauVar45) [16];
  undefined1 (*pauVar46) [32];
  int iVar47;
  int iVar48;
  ulong uVar49;
  uint uVar50;
  int iVar51;
  int iVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [28];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar115 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [64];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [16];
  float fVar198;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar197;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_2e0;
  long local_2d0;
  int local_2c8;
  int local_2b8;
  uint local_2a8;
  Mat local_288;
  undefined8 local_238;
  Mat *local_220;
  ulong local_218;
  void *local_210;
  void *local_208;
  _func_int **local_200;
  undefined1 local_1f8 [40];
  undefined1 auStack_1d0 [16];
  ulong uStack_1c0;
  size_t local_1b8;
  undefined1 local_1a8 [40];
  undefined1 local_180 [16];
  int local_170;
  size_t local_168;
  ulong local_158;
  Mat *local_150;
  ulong local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  Allocator *local_118;
  int local_110;
  Allocator *local_108;
  undefined1 local_100 [16];
  int local_f0;
  ulong local_e8;
  void *local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  ulong local_c8;
  int local_c0;
  Allocator *local_b8;
  undefined1 local_b0 [16];
  int local_a0;
  ulong local_98;
  undefined1 local_88 [16];
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined1 auVar83 [64];
  undefined1 auVar78 [32];
  undefined1 auVar107 [32];
  undefined1 auVar118 [32];
  
  uVar39 = bottom_blob->elemsize;
  iVar44 = bottom_blob->elempack;
  uVar49 = (ulong)iVar44;
  p_Var36 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
  uVar29 = 1;
  if (opt->use_packing_layout == true) {
    uVar29 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var36) & 7) != 0) {
      uVar29 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var36) & 3) == 0) * 3 + 1;
    }
  }
  local_148._0_4_ = bottom_blob->w;
  local_148._4_4_ = bottom_blob->h;
  uVar3 = *(ulong *)(&this->field_0xd4 + (long)p_Var36);
  uVar4 = *(ulong *)(&this->field_0xe4 + (long)p_Var36);
  uVar5 = *(ulong *)(&this->field_0xdc + (long)p_Var36);
  uVar6 = *(ulong *)(&this->field_0xfc + (long)p_Var36);
  uVar30 = bottom_blob->c;
  uVar37 = (ulong)uVar30;
  local_288.cstep = 0;
  auVar114 = (undefined1  [16])0x0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  p_Var10 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
  p_Var36 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_fma + (long)p_Var10);
  lVar38 = 0x10;
  if (((((*(int *)(&this->field_0xec + (long)p_Var10) < 1) && (*(int *)(p_Var36 + 0xf0) < 1)) &&
       (*(int *)(p_Var36 + 0xf4) < 1)) && (*(int *)(p_Var36 + 0xf8) < 1)) &&
     ((*(int *)(p_Var36 + 0x104) < 1 || (*(int *)(p_Var36 + 0x108) < 1)))) {
    auVar114 = (undefined1  [16])0x0;
    if (&local_288 != top_blob) {
      piVar11 = top_blob->refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      local_288.data = top_blob->data;
      local_288.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_288.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_288.elemsize = top_blob->elemsize;
      local_288.elempack = top_blob->elempack;
      local_288.allocator = top_blob->allocator;
      auVar114._0_4_ = top_blob->dims;
      auVar114._4_4_ = top_blob->w;
      uVar7 = top_blob->h;
      uVar8 = top_blob->d;
      auVar114._8_8_ = CONCAT44(uVar8,uVar7);
      local_288.c = top_blob->c;
      local_288.cstep = top_blob->cstep;
      local_288.dims = auVar114._0_4_;
      local_288.w = auVar114._4_4_;
      local_288._48_8_ = auVar114._8_8_;
    }
    p_Var36 = (_func_int *)
              ((long)&this->_vptr_DeconvolutionDepthWise_x86_fma +
              (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3]);
    lVar38 = 8;
  }
  uStack_140 = 0;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar6;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = local_148;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar5;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar4;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar3;
  auVar70 = vpcmpeqd_avx(auVar114,auVar114);
  auVar114 = vpaddd_avx(auVar169,auVar70);
  auVar114 = vpmulld_avx(auVar127,auVar114);
  auVar114 = vpaddd_avx(auVar114,auVar138);
  auVar169 = vpaddd_avx(auVar153,auVar70);
  local_88 = vpmulld_avx(auVar169,auVar112);
  auVar114 = vpaddd_avx(local_88,auVar114);
  local_138 = vpsubd_avx(auVar114,auVar70);
  sVar43 = (uVar39 / uVar49) * (ulong)uVar29;
  iVar51 = local_138._0_4_;
  iVar41 = local_138._4_4_;
  local_150 = top_blob;
  Mat::create(&local_288,iVar51,iVar41,*(int *)(p_Var36 + 0xd0) / (int)uVar29,sVar43,uVar29,
              *(Allocator **)(&opt->lightmode + lVar38));
  if ((local_288.data == (void *)0x0) || ((long)local_288.c * local_288.cstep == 0)) {
    iVar44 = -100;
  }
  else {
    p_Var36 = this->_vptr_DeconvolutionDepthWise_x86_fma[-3];
    iVar9 = *(int *)(&this->field_0x114 + (long)p_Var36);
    if ((uVar30 * iVar44 == iVar9) && (iVar9 == *(int *)(&this->field_0xd0 + (long)p_Var36))) {
      uVar29 = *(int *)(&this->field_0xd8 + (long)p_Var36) *
               *(int *)(&this->field_0xd4 + (long)p_Var36);
      local_158 = (ulong)uVar29;
      uVar1 = local_88._4_4_;
      iVar52 = (int)local_148;
      iVar9 = (int)(local_148 >> 0x20);
      if (iVar44 == 1) {
        if (0 < (int)uVar30) {
          local_220 = (Mat *)(local_288.cstep * local_288.elemsize);
          local_208 = local_288.data;
          pvVar12 = (this->weight_data_tm).data;
          iVar44 = bottom_blob->w;
          local_210 = bottom_blob->data;
          sVar43 = bottom_blob->elemsize;
          local_218 = bottom_blob->cstep * sVar43;
          auVar114 = vpcmpgtd_avx(local_138,(undefined1  [16])0x0);
          auVar114 = vpmovsxdq_avx(auVar114);
          uVar50 = vmovmskpd_avx(auVar114);
          uVar39 = 1;
          if (1 < (int)uVar30) {
            uVar39 = uVar37;
          }
          local_138._0_8_ = uVar39;
          local_148 = (long)(int)uVar29 << 2;
          iVar34 = -local_88._0_4_;
          local_2d0 = 0;
          do {
            if ((byte)((byte)uVar50 >> 1) != 0) {
              local_238 = (void *)(local_218 * local_2d0 + (long)local_210);
              pfVar40 = (float *)((long)local_220 * local_2d0 + (long)local_208);
              local_200 = this->_vptr_DeconvolutionDepthWise_x86_fma;
              iVar42 = 0;
              do {
                if ((uVar50 & 1) != 0) {
                  iVar47 = 0;
                  local_2b8 = iVar34;
                  do {
                    p_Var36 = local_200[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var36) == 0) {
                      auVar147 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar147 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var36) +
                                                  local_2d0 * 4));
                    }
                    auVar114 = auVar147._0_16_;
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var36)) {
                      iVar48 = 0;
                      do {
                        iVar31 = *(int *)(&this->field_0xe0 + (long)p_Var36) * iVar48 +
                                 (iVar42 - uVar1);
                        if (((-1 < iVar31) &&
                            (iVar32 = iVar31 / *(int *)(&this->field_0xe8 + (long)p_Var36),
                            iVar31 % *(int *)(&this->field_0xe8 + (long)p_Var36) == 0)) &&
                           (iVar32 < iVar9)) {
                          iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var36);
                          if (0 < (long)iVar31) {
                            lVar38 = 0;
                            iVar33 = local_2b8;
                            do {
                              if (((-1 < iVar33) &&
                                  (iVar35 = iVar33 / *(int *)(&this->field_0xe4 + (long)p_Var36),
                                  iVar33 % *(int *)(&this->field_0xe4 + (long)p_Var36) == 0)) &&
                                 (iVar35 < iVar52)) {
                                auVar114 = vfmadd231ss_fma(auVar147._0_16_,
                                                           ZEXT416(*(uint *)((long)pvVar12 +
                                                                            lVar38 * 4 +
                                                                            (ulong)(uint)(iVar31 * 
                                                  iVar48) * 4)),
                                                  ZEXT416(*(uint *)((long)local_238 +
                                                                   (long)iVar35 * 4 +
                                                                   (long)iVar32 *
                                                                   (long)iVar44 * sVar43)));
                                auVar147 = ZEXT1664(auVar114);
                              }
                              lVar38 = lVar38 + 1;
                              iVar33 = iVar33 + *(int *)(&this->field_0xdc + (long)p_Var36);
                            } while (iVar31 != lVar38);
                          }
                        }
                        auVar114 = auVar147._0_16_;
                        iVar48 = iVar48 + 1;
                      } while (iVar48 != *(int *)(&this->field_0xd8 + (long)p_Var36));
                    }
                    fVar197 = auVar114._0_4_;
                    fVar53 = fVar197;
                    switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var36)) {
                    case 1:
                      auVar114 = vmaxss_avx(auVar114,ZEXT416(0));
                      fVar53 = auVar114._0_4_;
                      break;
                    case 2:
                      auVar114 = vcmpss_avx(ZEXT816(0) << 0x40,auVar114,1);
                      auVar101._8_4_ = 0x3f800000;
                      auVar101._0_8_ = 0x3f8000003f800000;
                      auVar101._12_4_ = 0x3f800000;
                      auVar114 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x120 +
                                                                  (long)p_Var36)),auVar101,auVar114)
                      ;
                      fVar53 = auVar114._0_4_ * fVar197;
                      break;
                    case 3:
                      fVar197 = (float)(*(uint **)(&this->field_0x120 + (long)p_Var36))[1];
                      auVar114 = vmaxss_avx(auVar114,ZEXT416(**(uint **)(&this->field_0x120 +
                                                                        (long)p_Var36)));
                      fVar53 = auVar114._0_4_;
                      if (fVar197 < auVar114._0_4_) {
                        fVar53 = fVar197;
                      }
                      break;
                    case 4:
                      auVar114 = vminss_avx(auVar114,ZEXT416(0x42b0c0a5));
                      auVar70._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
                      auVar70._8_4_ = auVar114._8_4_ ^ 0x80000000;
                      auVar70._12_4_ = auVar114._12_4_ ^ 0x80000000;
                      auVar114 = vcmpss_avx(auVar114,ZEXT416(0xc2b0c0a5),1);
                      auVar100._8_4_ = 0x42b0c0a5;
                      auVar100._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar100._12_4_ = 0x42b0c0a5;
                      auVar114 = vblendvps_avx(auVar70,auVar100,auVar114);
                      fVar53 = expf(auVar114._0_4_);
                      fVar53 = 1.0 / (fVar53 + 1.0);
                      break;
                    case 5:
                      fVar53 = expf(fVar197);
                      fVar53 = logf(fVar53 + 1.0);
                      fVar53 = tanhf(fVar53);
                      fVar53 = fVar53 * fVar197;
                      break;
                    case 6:
                      fVar198 = **(float **)(&this->field_0x120 + (long)p_Var36);
                      fVar2 = (*(float **)(&this->field_0x120 + (long)p_Var36))[1];
                      fVar111 = -fVar2 / fVar198;
                      fVar53 = 0.0;
                      if ((fVar111 <= fVar197) &&
                         (fVar53 = fVar197, fVar197 <= fVar111 + 1.0 / fVar198)) {
                        auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar198),auVar114,
                                                   ZEXT416((uint)fVar2));
                        fVar53 = auVar114._0_4_ * fVar197;
                      }
                    }
                    *pfVar40 = fVar53;
                    pfVar40 = pfVar40 + 1;
                    iVar47 = iVar47 + 1;
                    local_2b8 = local_2b8 + 1;
                  } while (iVar47 != iVar51);
                }
                iVar42 = iVar42 + 1;
              } while (iVar42 != iVar41);
            }
            local_2d0 = local_2d0 + 1;
            pvVar12 = (void *)((long)pvVar12 + local_148);
          } while (local_2d0 != local_138._0_8_);
        }
      }
      else {
        local_220 = bottom_blob;
        if (iVar44 == 4) {
          local_218 = uVar49;
          if (0 < (int)uVar30) {
            local_210 = (void *)CONCAT44(local_210._4_4_,uVar29 * 4);
            auVar114 = vpcmpgtd_avx(local_138,(undefined1  [16])0x0);
            auVar114 = vpmovsxdq_avx(auVar114);
            uVar30 = vmovmskpd_avx(auVar114);
            bVar28 = (byte)uVar30 >> 1;
            local_208 = (void *)CONCAT71(local_208._1_7_,bVar28);
            local_2e0 = 0;
            auVar184 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
            auVar147 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar183._8_4_ = 0xc2b0c0a5;
            auVar183._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar183._12_4_ = 0xc2b0c0a5;
            auVar187._8_4_ = 0x3ab743ce;
            auVar187._0_8_ = 0x3ab743ce3ab743ce;
            auVar187._12_4_ = 0x3ab743ce;
            do {
              if (bVar28 != 0) {
                pvVar12 = (this->weight_data_tm).data;
                sVar43 = bottom_blob->elemsize;
                local_238 = (void *)(bottom_blob->cstep * local_2e0 * sVar43 +
                                    (long)bottom_blob->data);
                iVar44 = bottom_blob->w;
                pauVar45 = (undefined1 (*) [16])
                           (local_288.cstep * local_2e0 * local_288.elemsize + (long)local_288.data)
                ;
                local_200 = this->_vptr_DeconvolutionDepthWise_x86_fma;
                iVar34 = 0;
                do {
                  if ((uVar30 & 1) != 0) {
                    iVar42 = 0;
                    local_2c8 = -local_88._0_4_;
                    do {
                      p_Var36 = local_200[-3];
                      if (*(int *)(&this->field_0x10c + (long)p_Var36) == 0) {
                        auVar190 = ZEXT816(0) << 0x40;
                      }
                      else {
                        auVar190 = *(undefined1 (*) [16])
                                    (*(long *)(&this->field_0x1b0 + (long)p_Var36) +
                                    local_2e0 * 0x10);
                      }
                      auVar186 = ZEXT1664(auVar190);
                      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var36)) {
                        iVar48 = 0;
                        iVar47 = 0;
                        do {
                          iVar31 = *(int *)(&this->field_0xe0 + (long)p_Var36) * iVar47 +
                                   (iVar34 - local_88._4_4_);
                          if (((-1 < iVar31) &&
                              (iVar32 = iVar31 / *(int *)(&this->field_0xe8 + (long)p_Var36),
                              iVar31 % *(int *)(&this->field_0xe8 + (long)p_Var36) == 0)) &&
                             (iVar32 < iVar9)) {
                            lVar38 = (long)*(int *)(&this->field_0xd4 + (long)p_Var36);
                            if (0 < lVar38) {
                              uVar50 = *(int *)(&this->field_0xd4 + (long)p_Var36) * iVar48;
                              iVar31 = local_2c8;
                              do {
                                if (((-1 < iVar31) &&
                                    (iVar33 = iVar31 / *(int *)(&this->field_0xe4 + (long)p_Var36),
                                    iVar31 % *(int *)(&this->field_0xe4 + (long)p_Var36) == 0)) &&
                                   (iVar33 < iVar52)) {
                                  auVar114 = vfmadd231ps_fma(auVar186._0_16_,
                                                             *(undefined1 (*) [16])
                                                              ((long)local_238 +
                                                              (long)(iVar33 << 2) * 4 +
                                                              (long)iVar32 * (long)iVar44 * sVar43),
                                                             *(undefined1 (*) [16])
                                                              ((long)pvVar12 +
                                                              (ulong)uVar50 * 4 +
                                                              (long)(int)(uVar29 * 4 *
                                                                         (int)local_2e0) * 4));
                                  auVar186 = ZEXT1664(auVar114);
                                }
                                uVar50 = uVar50 + 4;
                                iVar31 = iVar31 + *(int *)(&this->field_0xdc + (long)p_Var36);
                                lVar38 = lVar38 + -1;
                              } while (lVar38 != 0);
                            }
                          }
                          auVar190 = auVar186._0_16_;
                          iVar47 = iVar47 + 1;
                          iVar48 = iVar48 + 4;
                        } while (iVar47 != *(int *)(&this->field_0xd8 + (long)p_Var36));
                      }
                      auVar114 = auVar147._0_16_;
                      auVar169 = auVar184._0_16_;
                      fVar53 = auVar190._4_4_;
                      fVar197 = auVar190._8_4_;
                      fVar198 = auVar190._12_4_;
                      switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var36)) {
                      case 1:
                        auVar190 = vmaxps_avx(auVar190,_DAT_00592010);
                        break;
                      case 2:
                        auVar114 = vmaxps_avx(auVar190,(undefined1  [16])0x0);
                        auVar169 = vminps_avx(auVar190,(undefined1  [16])0x0);
                        uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var36);
                        auVar193._4_4_ = uVar1;
                        auVar193._0_4_ = uVar1;
                        auVar193._8_4_ = uVar1;
                        auVar193._12_4_ = uVar1;
                        auVar190 = vfmadd213ps_fma(auVar193,auVar169,auVar114);
                        break;
                      case 3:
                        uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var36);
                        auVar72._4_4_ = uVar1;
                        auVar72._0_4_ = uVar1;
                        auVar72._8_4_ = uVar1;
                        auVar72._12_4_ = uVar1;
                        uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var36))[1];
                        auVar155._4_4_ = uVar1;
                        auVar155._0_4_ = uVar1;
                        auVar155._8_4_ = uVar1;
                        auVar155._12_4_ = uVar1;
                        auVar114 = vmaxps_avx(auVar190,auVar72);
                        auVar190 = vminps_avx(auVar155,auVar114);
                        break;
                      case 4:
                        auVar73._0_8_ = auVar190._0_8_ ^ 0x8000000080000000;
                        auVar73._8_4_ = -fVar197;
                        auVar73._12_4_ = -fVar198;
                        auVar91._8_4_ = 0x42b0c0a5;
                        auVar91._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar91._12_4_ = 0x42b0c0a5;
                        auVar70 = vminps_avx(auVar73,auVar91);
                        auVar92._8_4_ = 0xc2b0c0a5;
                        auVar92._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar92._12_4_ = 0xc2b0c0a5;
                        auVar112 = vmaxps_avx(auVar70,auVar92);
                        auVar156._8_4_ = 0x3fb8aa3b;
                        auVar156._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar156._12_4_ = 0x3fb8aa3b;
                        auVar70 = vfmadd213ps_fma(auVar156,auVar112,auVar169);
                        auVar191._0_4_ = (int)auVar70._0_4_;
                        auVar191._4_4_ = (int)auVar70._4_4_;
                        auVar191._8_4_ = (int)auVar70._8_4_;
                        auVar191._12_4_ = (int)auVar70._12_4_;
                        auVar153 = vcvtdq2ps_avx(auVar191);
                        auVar70 = vcmpps_avx(auVar70,auVar153,1);
                        auVar70 = vandps_avx(auVar70,auVar114);
                        auVar70 = vsubps_avx(auVar153,auVar70);
                        auVar93._8_4_ = 0x3f318000;
                        auVar93._0_8_ = 0x3f3180003f318000;
                        auVar93._12_4_ = 0x3f318000;
                        auVar153 = vfmsub231ps_fma(auVar112,auVar70,auVar93);
                        auVar94._8_4_ = 0x395e8083;
                        auVar94._0_8_ = 0x395e8083395e8083;
                        auVar94._12_4_ = 0x395e8083;
                        auVar112 = vfmsub231ps_fma(auVar153,auVar70,auVar94);
                        auVar192._0_4_ = auVar112._0_4_ * auVar112._0_4_;
                        auVar192._4_4_ = auVar112._4_4_ * auVar112._4_4_;
                        auVar192._8_4_ = auVar112._8_4_ * auVar112._8_4_;
                        auVar192._12_4_ = auVar112._12_4_ * auVar112._12_4_;
                        auVar174._8_4_ = 0x39506967;
                        auVar174._0_8_ = 0x3950696739506967;
                        auVar174._12_4_ = 0x39506967;
                        auVar95._8_4_ = 0x3ab743ce;
                        auVar95._0_8_ = 0x3ab743ce3ab743ce;
                        auVar95._12_4_ = 0x3ab743ce;
                        auVar153 = vfmadd213ps_fma(auVar174,auVar112,auVar95);
                        auVar96._8_4_ = 0x3c088908;
                        auVar96._0_8_ = 0x3c0889083c088908;
                        auVar96._12_4_ = 0x3c088908;
                        auVar153 = vfmadd213ps_fma(auVar153,auVar112,auVar96);
                        auVar97._8_4_ = 0x3d2aa9c1;
                        auVar97._0_8_ = 0x3d2aa9c13d2aa9c1;
                        auVar97._12_4_ = 0x3d2aa9c1;
                        auVar153 = vfmadd213ps_fma(auVar153,auVar112,auVar97);
                        auVar98._8_4_ = 0x3e2aaaaa;
                        auVar98._0_8_ = 0x3e2aaaaa3e2aaaaa;
                        auVar98._12_4_ = 0x3e2aaaaa;
                        auVar153 = vfmadd213ps_fma(auVar153,auVar112,auVar98);
                        auVar169 = vfmadd213ps_fma(auVar153,auVar112,auVar169);
                        auVar169 = vfmadd213ps_fma(auVar169,auVar192,auVar112);
                        auVar74._0_4_ = auVar169._0_4_ + auVar147._0_4_;
                        auVar74._4_4_ = auVar169._4_4_ + auVar147._4_4_;
                        auVar74._8_4_ = auVar169._8_4_ + auVar147._8_4_;
                        auVar74._12_4_ = auVar169._12_4_ + auVar147._12_4_;
                        auVar157._0_4_ = (int)auVar70._0_4_;
                        auVar157._4_4_ = (int)auVar70._4_4_;
                        auVar157._8_4_ = (int)auVar70._8_4_;
                        auVar157._12_4_ = (int)auVar70._12_4_;
                        auVar169 = vpslld_avx(auVar157,0x17);
                        auVar169 = vpaddd_avx(auVar169,auVar114);
                        auVar70 = vfmadd213ps_fma(auVar169,auVar74,auVar114);
                        auVar169 = vrcpps_avx(auVar70);
                        auVar114 = vfmsub213ps_fma(auVar70,auVar169,auVar114);
                        auVar190 = vfnmadd132ps_fma(auVar114,auVar169,auVar169);
                        break;
                      case 5:
                        auVar178._8_4_ = 0x42b0c0a5;
                        auVar178._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar178._12_4_ = 0x42b0c0a5;
                        auVar70 = vminps_avx(auVar190,auVar178);
                        auVar112 = vmaxps_avx(auVar183,auVar70);
                        auVar185._8_4_ = 0x3fb8aa3b;
                        auVar185._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar185._12_4_ = 0x3fb8aa3b;
                        auVar70 = vfmadd213ps_fma(auVar185,auVar112,auVar169);
                        auVar170._0_4_ = (int)auVar70._0_4_;
                        auVar170._4_4_ = (int)auVar70._4_4_;
                        auVar170._8_4_ = (int)auVar70._8_4_;
                        auVar170._12_4_ = (int)auVar70._12_4_;
                        auVar153 = vcvtdq2ps_avx(auVar170);
                        auVar70 = vcmpps_avx(auVar70,auVar153,1);
                        auVar70 = vandps_avx(auVar70,auVar114);
                        auVar70 = vsubps_avx(auVar153,auVar70);
                        auVar54._8_4_ = 0x3f318000;
                        auVar54._0_8_ = 0x3f3180003f318000;
                        auVar54._12_4_ = 0x3f318000;
                        auVar153 = vfmsub231ps_fma(auVar112,auVar70,auVar54);
                        auVar85._8_4_ = 0xb95e8083;
                        auVar85._0_8_ = 0xb95e8083b95e8083;
                        auVar85._12_4_ = 0xb95e8083;
                        auVar112 = vfnmsub231ps_fma(auVar153,auVar70,auVar85);
                        auVar171._0_4_ = auVar112._0_4_ * auVar112._0_4_;
                        auVar171._4_4_ = auVar112._4_4_ * auVar112._4_4_;
                        auVar171._8_4_ = auVar112._8_4_ * auVar112._8_4_;
                        auVar171._12_4_ = auVar112._12_4_ * auVar112._12_4_;
                        auVar179._8_4_ = 0x39506967;
                        auVar179._0_8_ = 0x3950696739506967;
                        auVar179._12_4_ = 0x39506967;
                        auVar153 = vfmadd213ps_fma(auVar179,auVar112,auVar187);
                        auVar116._8_4_ = 0x3c088908;
                        auVar116._0_8_ = 0x3c0889083c088908;
                        auVar116._12_4_ = 0x3c088908;
                        auVar153 = vfmadd213ps_fma(auVar153,auVar112,auVar116);
                        auVar148._8_4_ = 0x3d2aa9c1;
                        auVar148._0_8_ = 0x3d2aa9c13d2aa9c1;
                        auVar148._12_4_ = 0x3d2aa9c1;
                        auVar153 = vfmadd213ps_fma(auVar153,auVar112,auVar148);
                        auVar129._8_4_ = 0x3e2aaaaa;
                        auVar129._0_8_ = 0x3e2aaaaa3e2aaaaa;
                        auVar129._12_4_ = 0x3e2aaaaa;
                        auVar153 = vfmadd213ps_fma(auVar153,auVar112,auVar129);
                        auVar153 = vfmadd213ps_fma(auVar153,auVar112,auVar169);
                        auVar153 = vfmadd213ps_fma(auVar153,auVar171,auVar112);
                        auVar86._0_4_ = auVar153._0_4_ + auVar147._0_4_;
                        auVar86._4_4_ = auVar153._4_4_ + auVar147._4_4_;
                        auVar86._8_4_ = auVar153._8_4_ + auVar147._8_4_;
                        auVar86._12_4_ = auVar153._12_4_ + auVar147._12_4_;
                        auVar69._0_4_ = (int)auVar70._0_4_;
                        auVar69._4_4_ = (int)auVar70._4_4_;
                        auVar69._8_4_ = (int)auVar70._8_4_;
                        auVar69._12_4_ = (int)auVar70._12_4_;
                        auVar70 = vpslld_avx(auVar69,0x17);
                        auVar70 = vpaddd_avx(auVar70,auVar114);
                        auVar138 = vfmadd213ps_fma(auVar70,auVar86,auVar114);
                        auVar87._8_4_ = 0x800000;
                        auVar87._0_8_ = 0x80000000800000;
                        auVar87._12_4_ = 0x800000;
                        auVar70 = vmaxps_avx(auVar138,auVar87);
                        auVar153 = vpsrld_avx(auVar70,0x17);
                        auVar130._8_4_ = 0xffffff82;
                        auVar130._0_8_ = 0xffffff82ffffff82;
                        auVar130._12_4_ = 0xffffff82;
                        auVar153 = vpaddd_avx(auVar153,auVar130);
                        auVar131._8_4_ = 0x807fffff;
                        auVar131._0_8_ = 0x807fffff807fffff;
                        auVar131._12_4_ = 0x807fffff;
                        auVar70 = vandps_avx(auVar70,auVar131);
                        auVar127 = vorps_avx(auVar70,auVar169);
                        auVar112 = vcvtdq2ps_avx(auVar153);
                        auVar132._8_4_ = 0x3f3504f3;
                        auVar132._0_8_ = 0x3f3504f33f3504f3;
                        auVar132._12_4_ = 0x3f3504f3;
                        auVar153 = vcmpps_avx(auVar127,auVar132,1);
                        auVar70 = vandps_avx(auVar153,auVar127);
                        auVar88._0_4_ = auVar127._0_4_ + -1.0 + auVar70._0_4_;
                        auVar88._4_4_ = auVar127._4_4_ + -1.0 + auVar70._4_4_;
                        auVar88._8_4_ = auVar127._8_4_ + -1.0 + auVar70._8_4_;
                        auVar88._12_4_ = auVar127._12_4_ + -1.0 + auVar70._12_4_;
                        auVar114 = vandps_avx(auVar153,auVar114);
                        auVar70 = vsubps_avx(auVar112,auVar114);
                        auVar154._0_4_ = auVar88._0_4_ * auVar88._0_4_;
                        auVar154._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                        auVar154._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                        auVar154._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                        auVar172._8_4_ = 0x3d9021bb;
                        auVar172._0_8_ = 0x3d9021bb3d9021bb;
                        auVar172._12_4_ = 0x3d9021bb;
                        auVar139._8_4_ = 0xbdebd1b8;
                        auVar139._0_8_ = 0xbdebd1b8bdebd1b8;
                        auVar139._12_4_ = 0xbdebd1b8;
                        auVar114 = vfmadd213ps_fma(auVar172,auVar88,auVar139);
                        auVar140._8_4_ = 0x3def251a;
                        auVar140._0_8_ = 0x3def251a3def251a;
                        auVar140._12_4_ = 0x3def251a;
                        auVar114 = vfmadd213ps_fma(auVar114,auVar88,auVar140);
                        auVar141._8_4_ = 0xbdfe5d4f;
                        auVar141._0_8_ = 0xbdfe5d4fbdfe5d4f;
                        auVar141._12_4_ = 0xbdfe5d4f;
                        auVar114 = vfmadd213ps_fma(auVar114,auVar88,auVar141);
                        auVar142._8_4_ = 0x3e11e9bf;
                        auVar142._0_8_ = 0x3e11e9bf3e11e9bf;
                        auVar142._12_4_ = 0x3e11e9bf;
                        auVar114 = vfmadd213ps_fma(auVar114,auVar88,auVar142);
                        auVar143._8_4_ = 0xbe2aae50;
                        auVar143._0_8_ = 0xbe2aae50be2aae50;
                        auVar143._12_4_ = 0xbe2aae50;
                        auVar114 = vfmadd213ps_fma(auVar114,auVar88,auVar143);
                        auVar144._8_4_ = 0x3e4cceac;
                        auVar144._0_8_ = 0x3e4cceac3e4cceac;
                        auVar144._12_4_ = 0x3e4cceac;
                        auVar114 = vfmadd213ps_fma(auVar114,auVar88,auVar144);
                        auVar145._8_4_ = 0xbe7ffffc;
                        auVar145._0_8_ = 0xbe7ffffcbe7ffffc;
                        auVar145._12_4_ = 0xbe7ffffc;
                        auVar114 = vfmadd213ps_fma(auVar114,auVar88,auVar145);
                        auVar146._8_4_ = 0x3eaaaaaa;
                        auVar146._0_8_ = 0x3eaaaaaa3eaaaaaa;
                        auVar146._12_4_ = 0x3eaaaaaa;
                        auVar114 = vfmadd213ps_fma(auVar114,auVar88,auVar146);
                        auVar168._0_4_ = auVar154._0_4_ * auVar88._0_4_ * auVar114._0_4_;
                        auVar168._4_4_ = auVar154._4_4_ * auVar88._4_4_ * auVar114._4_4_;
                        auVar168._8_4_ = auVar154._8_4_ * auVar88._8_4_ * auVar114._8_4_;
                        auVar168._12_4_ = auVar154._12_4_ * auVar88._12_4_ * auVar114._12_4_;
                        auVar173._8_4_ = 0xb95e8083;
                        auVar173._0_8_ = 0xb95e8083b95e8083;
                        auVar173._12_4_ = 0xb95e8083;
                        auVar114 = vfmadd231ps_fma(auVar168,auVar70,auVar173);
                        auVar153 = vfmsub231ps_fma(auVar114,auVar169,auVar154);
                        auVar114 = vcmpps_avx(auVar138,ZEXT816(0) << 0x20,2);
                        auVar153 = vsubps_avx(auVar153,auVar88);
                        auVar180._8_4_ = 0x42b0c0a5;
                        auVar180._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar180._12_4_ = 0x42b0c0a5;
                        auVar149._8_4_ = 0x3f800000;
                        auVar149._0_8_ = 0x3f8000003f800000;
                        auVar149._12_4_ = 0x3f800000;
                        auVar70 = vfnmadd231ps_fma(auVar153,auVar54,auVar70);
                        auVar89._0_4_ = auVar70._0_4_ + auVar70._0_4_;
                        auVar89._4_4_ = auVar70._4_4_ + auVar70._4_4_;
                        auVar89._8_4_ = auVar70._8_4_ + auVar70._8_4_;
                        auVar89._12_4_ = auVar70._12_4_ + auVar70._12_4_;
                        auVar133._8_4_ = 0x7fffffff;
                        auVar133._0_8_ = 0x7fffffff7fffffff;
                        auVar133._12_4_ = 0x7fffffff;
                        auVar114 = vblendvps_avx(auVar89,auVar133,auVar114);
                        auVar114 = vminps_avx(auVar180,auVar114);
                        auVar153 = vmaxps_avx(auVar183,auVar114);
                        auVar114 = vfmadd213ps_fma(auVar185,auVar153,auVar169);
                        auVar134._0_4_ = (int)auVar114._0_4_;
                        auVar134._4_4_ = (int)auVar114._4_4_;
                        auVar134._8_4_ = (int)auVar114._8_4_;
                        auVar134._12_4_ = (int)auVar114._12_4_;
                        auVar70 = vcvtdq2ps_avx(auVar134);
                        auVar114 = vcmpps_avx(auVar114,auVar70,1);
                        auVar114 = vandps_avx(auVar114,auVar149);
                        auVar114 = vsubps_avx(auVar70,auVar114);
                        auVar70 = vfmsub231ps_fma(auVar153,auVar114,auVar54);
                        auVar55._8_4_ = 0xb95e8083;
                        auVar55._0_8_ = 0xb95e8083b95e8083;
                        auVar55._12_4_ = 0xb95e8083;
                        auVar153 = vfnmsub231ps_fma(auVar70,auVar114,auVar55);
                        auVar135._0_4_ = auVar153._0_4_ * auVar153._0_4_;
                        auVar135._4_4_ = auVar153._4_4_ * auVar153._4_4_;
                        auVar135._8_4_ = auVar153._8_4_ * auVar153._8_4_;
                        auVar135._12_4_ = auVar153._12_4_ * auVar153._12_4_;
                        auVar70 = vfmadd213ps_fma(auVar179,auVar153,auVar187);
                        auVar70 = vfmadd213ps_fma(auVar70,auVar153,auVar116);
                        auVar70 = vfmadd213ps_fma(auVar70,auVar153,auVar148);
                        auVar56._8_4_ = 0x3e2aaaaa;
                        auVar56._0_8_ = 0x3e2aaaaa3e2aaaaa;
                        auVar56._12_4_ = 0x3e2aaaaa;
                        auVar70 = vfmadd213ps_fma(auVar70,auVar153,auVar56);
                        auVar184 = ZEXT1664(auVar169);
                        auVar169 = vfmadd213ps_fma(auVar70,auVar153,auVar169);
                        auVar169 = vfmadd213ps_fma(auVar169,auVar135,auVar153);
                        auVar71._0_4_ = auVar169._0_4_ + 1.0;
                        auVar71._4_4_ = auVar169._4_4_ + 1.0;
                        auVar71._8_4_ = auVar169._8_4_ + 1.0;
                        auVar71._12_4_ = auVar169._12_4_ + 1.0;
                        auVar90._0_4_ = (int)auVar114._0_4_;
                        auVar90._4_4_ = (int)auVar114._4_4_;
                        auVar90._8_4_ = (int)auVar114._8_4_;
                        auVar90._12_4_ = (int)auVar114._12_4_;
                        auVar114 = vpslld_avx(auVar90,0x17);
                        auVar114 = vpaddd_avx(auVar114,auVar149);
                        auVar147 = ZEXT1664(auVar149);
                        auVar169 = vfmadd213ps_fma(auVar114,auVar71,auVar149);
                        auVar114 = vrcpps_avx(auVar169);
                        auVar136._0_4_ = auVar114._0_4_ + auVar114._0_4_;
                        auVar136._4_4_ = auVar114._4_4_ + auVar114._4_4_;
                        auVar136._8_4_ = auVar114._8_4_ + auVar114._8_4_;
                        auVar136._12_4_ = auVar114._12_4_ + auVar114._12_4_;
                        auVar117._8_4_ = 0x40000000;
                        auVar117._0_8_ = 0x4000000040000000;
                        auVar117._12_4_ = 0x40000000;
                        auVar169 = vfmsub213ps_fma(auVar169,auVar136,auVar117);
                        auVar114 = vfnmadd213ps_fma(auVar169,auVar114,auVar136);
                        auVar190 = vfmsub231ps_fma(auVar190,auVar190,auVar114);
                        break;
                      case 6:
                        uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var36);
                        auVar75._4_4_ = uVar1;
                        auVar75._0_4_ = uVar1;
                        auVar75._8_4_ = uVar1;
                        auVar75._12_4_ = uVar1;
                        uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var36))[1];
                        auVar99._4_4_ = uVar1;
                        auVar99._0_4_ = uVar1;
                        auVar99._8_4_ = uVar1;
                        auVar99._12_4_ = uVar1;
                        auVar169 = vfmadd231ps_fma(auVar99,auVar190,auVar75);
                        auVar169 = vmaxps_avx(auVar169,_DAT_00592010);
                        auVar114 = vminps_avx(auVar169,auVar114);
                        auVar190._0_4_ = auVar190._0_4_ * auVar114._0_4_;
                        auVar190._4_4_ = fVar53 * auVar114._4_4_;
                        auVar190._8_4_ = fVar197 * auVar114._8_4_;
                        auVar190._12_4_ = fVar198 * auVar114._12_4_;
                      }
                      *pauVar45 = auVar190;
                      pauVar45 = pauVar45 + 1;
                      iVar42 = iVar42 + 1;
                      local_2c8 = local_2c8 + 1;
                    } while (iVar42 != iVar51);
                  }
                  iVar34 = iVar34 + 1;
                } while (iVar34 != iVar41);
              }
              local_2e0 = local_2e0 + 1;
            } while (local_2e0 != uVar37);
          }
        }
        else if ((iVar44 == 8) && (local_218 = uVar49, 0 < (int)uVar30)) {
          local_210 = (void *)CONCAT44(local_210._4_4_,uVar29 * 8);
          auVar114 = vpcmpgtd_avx(local_138,(undefined1  [16])0x0);
          auVar114 = vpmovsxdq_avx(auVar114);
          uVar30 = vmovmskpd_avx(auVar114);
          bVar28 = (byte)uVar30 >> 1;
          local_208 = (void *)CONCAT71(local_208._1_7_,bVar28);
          local_2e0 = 0;
          auVar184 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                        CONCAT424(0xc2b0c0a5,
                                                  CONCAT420(0xc2b0c0a5,
                                                            CONCAT416(0xc2b0c0a5,
                                                                      CONCAT412(0xc2b0c0a5,
                                                                                CONCAT48(0xc2b0c0a5,
                                                                                                                                                                                  
                                                  0xc2b0c0a5c2b0c0a5)))))));
          auVar150._8_4_ = 0x3f000000;
          auVar150._0_8_ = 0x3f0000003f000000;
          auVar150._12_4_ = 0x3f000000;
          auVar150._16_4_ = 0x3f000000;
          auVar150._20_4_ = 0x3f000000;
          auVar150._24_4_ = 0x3f000000;
          auVar150._28_4_ = 0x3f000000;
          auVar186 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                        CONCAT424(0x3fb8aa3b,
                                                  CONCAT420(0x3fb8aa3b,
                                                            CONCAT416(0x3fb8aa3b,
                                                                      CONCAT412(0x3fb8aa3b,
                                                                                CONCAT48(0x3fb8aa3b,
                                                                                                                                                                                  
                                                  0x3fb8aa3b3fb8aa3b)))))));
          auVar147 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar189 = ZEXT3264(CONCAT428(0x39506967,
                                        CONCAT424(0x39506967,
                                                  CONCAT420(0x39506967,
                                                            CONCAT416(0x39506967,
                                                                      CONCAT412(0x39506967,
                                                                                CONCAT48(0x39506967,
                                                                                                                                                                                  
                                                  0x3950696739506967)))))));
          do {
            if (bVar28 != 0) {
              pvVar12 = (this->weight_data_tm).data;
              sVar43 = bottom_blob->elemsize;
              local_238 = (void *)(bottom_blob->cstep * local_2e0 * sVar43 + (long)bottom_blob->data
                                  );
              iVar44 = bottom_blob->w;
              pauVar46 = (undefined1 (*) [32])
                         (local_288.cstep * local_2e0 * local_288.elemsize + (long)local_288.data);
              local_200 = this->_vptr_DeconvolutionDepthWise_x86_fma;
              iVar34 = 0;
              do {
                if ((uVar30 & 1) != 0) {
                  iVar42 = 0;
                  local_2c8 = -local_88._0_4_;
                  do {
                    p_Var36 = local_200[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var36) == 0) {
                      auVar82 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar82 = ZEXT3264(*(undefined1 (*) [32])
                                          (*(long *)(&this->field_0x1b0 + (long)p_Var36) +
                                          local_2e0 * 0x20));
                    }
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var36)) {
                      iVar48 = 0;
                      iVar47 = 0;
                      do {
                        iVar31 = *(int *)(&this->field_0xe0 + (long)p_Var36) * iVar47 +
                                 (iVar34 - local_88._4_4_);
                        if (((-1 < iVar31) &&
                            (iVar32 = iVar31 / *(int *)(&this->field_0xe8 + (long)p_Var36),
                            iVar31 % *(int *)(&this->field_0xe8 + (long)p_Var36) == 0)) &&
                           (iVar32 < iVar9)) {
                          lVar38 = (long)*(int *)(&this->field_0xd4 + (long)p_Var36);
                          if (0 < lVar38) {
                            uVar50 = *(int *)(&this->field_0xd4 + (long)p_Var36) * iVar48;
                            iVar31 = local_2c8;
                            do {
                              if (((-1 < iVar31) &&
                                  (iVar33 = iVar31 / *(int *)(&this->field_0xe4 + (long)p_Var36),
                                  iVar31 % *(int *)(&this->field_0xe4 + (long)p_Var36) == 0)) &&
                                 (iVar33 < iVar52)) {
                                auVar114 = vfmadd231ps_fma(auVar82._0_32_,
                                                           *(undefined1 (*) [32])
                                                            ((long)local_238 +
                                                            (long)(iVar33 << 3) * 4 +
                                                            (long)iVar32 * (long)iVar44 * sVar43),
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar12 +
                                                            (ulong)uVar50 * 4 +
                                                            (long)(int)(uVar29 * 8 * (int)local_2e0)
                                                            * 4));
                                auVar82 = ZEXT1664(auVar114);
                              }
                              uVar50 = uVar50 + 8;
                              iVar31 = iVar31 + *(int *)(&this->field_0xdc + (long)p_Var36);
                              lVar38 = lVar38 + -1;
                            } while (lVar38 != 0);
                          }
                        }
                        iVar47 = iVar47 + 1;
                        iVar48 = iVar48 + 8;
                      } while (iVar47 != *(int *)(&this->field_0xd8 + (long)p_Var36));
                    }
                    auVar81 = auVar82._0_32_;
                    auVar64 = auVar147._0_32_;
                    auVar62 = auVar189._0_32_;
                    auVar77 = auVar184._0_32_;
                    auVar126 = auVar186._0_32_;
                    fVar53 = auVar147._0_4_;
                    fVar197 = auVar147._4_4_;
                    fVar198 = auVar147._8_4_;
                    fVar2 = auVar147._12_4_;
                    fVar111 = auVar147._16_4_;
                    fVar14 = auVar147._20_4_;
                    fVar15 = auVar147._24_4_;
                    fVar16 = auVar147._28_4_;
                    auVar83._28_36_ = auVar82._28_36_;
                    switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var36)) {
                    case 1:
                      auVar81 = vmaxps_avx(auVar81,_DAT_005970e0);
                      break;
                    case 2:
                      auVar64 = vmaxps_avx(auVar81,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      auVar81 = vminps_avx(auVar81,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var36);
                      auVar80._4_4_ = uVar1;
                      auVar80._0_4_ = uVar1;
                      auVar80._8_4_ = uVar1;
                      auVar80._12_4_ = uVar1;
                      auVar80._16_4_ = uVar1;
                      auVar80._20_4_ = uVar1;
                      auVar80._24_4_ = uVar1;
                      auVar80._28_4_ = uVar1;
                      auVar114 = vfmadd213ps_fma(auVar80,auVar81,auVar64);
                      auVar81 = ZEXT1632(auVar114);
                      break;
                    case 3:
                      uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var36);
                      auVar109._4_4_ = uVar1;
                      auVar109._0_4_ = uVar1;
                      auVar109._8_4_ = uVar1;
                      auVar109._12_4_ = uVar1;
                      auVar109._16_4_ = uVar1;
                      auVar109._20_4_ = uVar1;
                      auVar109._24_4_ = uVar1;
                      auVar109._28_4_ = uVar1;
                      uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var36))[1];
                      auVar196._4_4_ = uVar1;
                      auVar196._0_4_ = uVar1;
                      auVar196._8_4_ = uVar1;
                      auVar196._12_4_ = uVar1;
                      auVar196._16_4_ = uVar1;
                      auVar196._20_4_ = uVar1;
                      auVar196._24_4_ = uVar1;
                      auVar196._28_4_ = uVar1;
                      auVar81 = vmaxps_avx(auVar81,auVar109);
                      auVar81 = vminps_avx(auVar196,auVar81);
                      break;
                    case 4:
                      auVar76._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                      auVar76._8_4_ = -auVar82._8_4_;
                      auVar76._12_4_ = -auVar82._12_4_;
                      auVar76._16_4_ = -auVar82._16_4_;
                      auVar76._20_4_ = -auVar82._20_4_;
                      auVar76._24_4_ = -auVar82._24_4_;
                      auVar76._28_4_ = auVar82._28_4_ ^ 0x80000000;
                      auVar65._8_4_ = 0x42b0c0a5;
                      auVar65._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar65._12_4_ = 0x42b0c0a5;
                      auVar65._16_4_ = 0x42b0c0a5;
                      auVar65._20_4_ = 0x42b0c0a5;
                      auVar65._24_4_ = 0x42b0c0a5;
                      auVar65._28_4_ = 0x42b0c0a5;
                      auVar81 = vminps_avx(auVar76,auVar65);
                      auVar77 = vmaxps_avx(auVar77,auVar81);
                      auVar114 = vfmadd213ps_fma(auVar126,auVar77,auVar150);
                      auVar126 = vroundps_avx(ZEXT1632(auVar114),1);
                      auVar81 = vcmpps_avx(ZEXT1632(auVar114),auVar126,1);
                      auVar81 = vandps_avx(auVar81,auVar64);
                      auVar81 = vsubps_avx(auVar126,auVar81);
                      auVar66._8_4_ = 0x3f318000;
                      auVar66._0_8_ = 0x3f3180003f318000;
                      auVar66._12_4_ = 0x3f318000;
                      auVar66._16_4_ = 0x3f318000;
                      auVar66._20_4_ = 0x3f318000;
                      auVar66._24_4_ = 0x3f318000;
                      auVar66._28_4_ = 0x3f318000;
                      auVar114 = vfmsub231ps_fma(auVar77,auVar81,auVar66);
                      auVar122._8_4_ = 0x395e8083;
                      auVar122._0_8_ = 0x395e8083395e8083;
                      auVar122._12_4_ = 0x395e8083;
                      auVar122._16_4_ = 0x395e8083;
                      auVar122._20_4_ = 0x395e8083;
                      auVar122._24_4_ = 0x395e8083;
                      auVar122._28_4_ = 0x395e8083;
                      auVar169 = vfmsub231ps_fma(ZEXT1632(auVar114),auVar81,auVar122);
                      auVar77 = ZEXT1632(auVar169);
                      auVar18._28_4_ = auVar126._28_4_;
                      auVar18._0_28_ =
                           ZEXT1628(CONCAT412(auVar169._12_4_ * auVar169._12_4_,
                                              CONCAT48(auVar169._8_4_ * auVar169._8_4_,
                                                       CONCAT44(auVar169._4_4_ * auVar169._4_4_,
                                                                auVar169._0_4_ * auVar169._0_4_))));
                      auVar67._8_4_ = 0x3ab743ce;
                      auVar67._0_8_ = 0x3ab743ce3ab743ce;
                      auVar67._12_4_ = 0x3ab743ce;
                      auVar67._16_4_ = 0x3ab743ce;
                      auVar67._20_4_ = 0x3ab743ce;
                      auVar67._24_4_ = 0x3ab743ce;
                      auVar67._28_4_ = 0x3ab743ce;
                      auVar114 = vfmadd213ps_fma(auVar62,auVar77,auVar67);
                      auVar123._8_4_ = 0x3c088908;
                      auVar123._0_8_ = 0x3c0889083c088908;
                      auVar123._12_4_ = 0x3c088908;
                      auVar123._16_4_ = 0x3c088908;
                      auVar123._20_4_ = 0x3c088908;
                      auVar123._24_4_ = 0x3c088908;
                      auVar123._28_4_ = 0x3c088908;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar77,auVar123);
                      auVar124._8_4_ = 0x3d2aa9c1;
                      auVar124._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar124._12_4_ = 0x3d2aa9c1;
                      auVar124._16_4_ = 0x3d2aa9c1;
                      auVar124._20_4_ = 0x3d2aa9c1;
                      auVar124._24_4_ = 0x3d2aa9c1;
                      auVar124._28_4_ = 0x3d2aa9c1;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar77,auVar124);
                      auVar125._8_4_ = 0x3e2aaaaa;
                      auVar125._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar125._12_4_ = 0x3e2aaaaa;
                      auVar125._16_4_ = 0x3e2aaaaa;
                      auVar125._20_4_ = 0x3e2aaaaa;
                      auVar125._24_4_ = 0x3e2aaaaa;
                      auVar125._28_4_ = 0x3e2aaaaa;
                      auVar77 = ZEXT1632(auVar169);
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar77,auVar125);
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar77,auVar150);
                      auVar70 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar18,auVar77);
                      auVar68._0_4_ = (int)auVar81._0_4_;
                      auVar68._4_4_ = (int)auVar81._4_4_;
                      auVar68._8_4_ = (int)auVar81._8_4_;
                      auVar68._12_4_ = (int)auVar81._12_4_;
                      auVar78._16_4_ = (int)auVar81._16_4_;
                      auVar78._0_16_ = auVar68;
                      auVar78._20_4_ = (int)auVar81._20_4_;
                      auVar78._24_4_ = (int)auVar81._24_4_;
                      auVar78._28_4_ = (int)auVar81._28_4_;
                      auVar169 = vpslld_avx(auVar68,0x17);
                      auVar114 = vpslld_avx(auVar78._16_16_,0x17);
                      auVar115._8_4_ = 0x3f800000;
                      auVar115._0_8_ = 0x3f8000003f800000;
                      auVar115._12_4_ = 0x3f800000;
                      auVar114 = vpaddd_avx(auVar114,auVar115);
                      auVar169 = vpaddd_avx(auVar169,auVar115);
                      auVar79._16_16_ = auVar114;
                      auVar79._0_16_ = auVar169;
                      auVar110._0_4_ = auVar70._0_4_ + fVar53;
                      auVar110._4_4_ = auVar70._4_4_ + fVar197;
                      auVar110._8_4_ = auVar70._8_4_ + fVar198;
                      auVar110._12_4_ = auVar70._12_4_ + fVar2;
                      auVar110._16_4_ = fVar111 + 0.0;
                      auVar110._20_4_ = fVar14 + 0.0;
                      auVar110._24_4_ = fVar15 + 0.0;
                      auVar110._28_4_ = fVar16 + 0.0;
                      auVar114 = vfmadd213ps_fma(auVar79,auVar110,auVar64);
                      auVar81 = vrcpps_avx(ZEXT1632(auVar114));
                      auVar114 = vfmsub213ps_fma(ZEXT1632(auVar114),auVar81,auVar64);
                      auVar114 = vfnmadd132ps_fma(ZEXT1632(auVar114),auVar81,auVar81);
                      auVar81 = ZEXT1632(auVar114);
                      break;
                    case 5:
                      auVar181._8_4_ = 0x42b0c0a5;
                      auVar181._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar181._12_4_ = 0x42b0c0a5;
                      auVar181._16_4_ = 0x42b0c0a5;
                      auVar181._20_4_ = 0x42b0c0a5;
                      auVar181._24_4_ = 0x42b0c0a5;
                      auVar181._28_4_ = 0x42b0c0a5;
                      auVar81 = vminps_avx(auVar181,auVar81);
                      auVar17 = vmaxps_avx(auVar77,auVar81);
                      auVar114 = vfmadd213ps_fma(auVar126,auVar17,auVar150);
                      auVar103 = vroundps_avx(ZEXT1632(auVar114),1);
                      auVar81 = vcmpps_avx(ZEXT1632(auVar114),auVar103,1);
                      auVar81 = vandps_avx(auVar81,auVar64);
                      auVar81 = vsubps_avx(auVar103,auVar81);
                      auVar151._8_4_ = 0x3f318000;
                      auVar151._0_8_ = 0x3f3180003f318000;
                      auVar151._12_4_ = 0x3f318000;
                      auVar151._16_4_ = 0x3f318000;
                      auVar151._20_4_ = 0x3f318000;
                      auVar151._24_4_ = 0x3f318000;
                      auVar151._28_4_ = 0x3f318000;
                      auVar114 = vfmsub231ps_fma(auVar17,auVar81,auVar151);
                      auVar57._8_4_ = 0xb95e8083;
                      auVar57._0_8_ = 0xb95e8083b95e8083;
                      auVar57._12_4_ = 0xb95e8083;
                      auVar57._16_4_ = 0xb95e8083;
                      auVar57._20_4_ = 0xb95e8083;
                      auVar57._24_4_ = 0xb95e8083;
                      auVar57._28_4_ = 0xb95e8083;
                      auVar169 = vfnmsub231ps_fma(ZEXT1632(auVar114),auVar81,auVar57);
                      auVar57 = ZEXT1632(auVar169);
                      auVar17._28_4_ = auVar103._28_4_;
                      auVar17._0_28_ =
                           ZEXT1628(CONCAT412(auVar169._12_4_ * auVar169._12_4_,
                                              CONCAT48(auVar169._8_4_ * auVar169._8_4_,
                                                       CONCAT44(auVar169._4_4_ * auVar169._4_4_,
                                                                auVar169._0_4_ * auVar169._0_4_))));
                      auVar188._8_4_ = 0x3ab743ce;
                      auVar188._0_8_ = 0x3ab743ce3ab743ce;
                      auVar188._12_4_ = 0x3ab743ce;
                      auVar188._16_4_ = 0x3ab743ce;
                      auVar188._20_4_ = 0x3ab743ce;
                      auVar188._24_4_ = 0x3ab743ce;
                      auVar188._28_4_ = 0x3ab743ce;
                      auVar114 = vfmadd213ps_fma(auVar62,auVar57,auVar188);
                      auVar158._8_4_ = 0x3c088908;
                      auVar158._0_8_ = 0x3c0889083c088908;
                      auVar158._12_4_ = 0x3c088908;
                      auVar158._16_4_ = 0x3c088908;
                      auVar158._20_4_ = 0x3c088908;
                      auVar158._24_4_ = 0x3c088908;
                      auVar158._28_4_ = 0x3c088908;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar57,auVar158);
                      auVar137._8_4_ = 0x3d2aa9c1;
                      auVar137._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar137._12_4_ = 0x3d2aa9c1;
                      auVar137._16_4_ = 0x3d2aa9c1;
                      auVar137._20_4_ = 0x3d2aa9c1;
                      auVar137._24_4_ = 0x3d2aa9c1;
                      auVar137._28_4_ = 0x3d2aa9c1;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar57,auVar137);
                      auVar58._8_4_ = 0x3e2aaaaa;
                      auVar58._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar58._12_4_ = 0x3e2aaaaa;
                      auVar58._16_4_ = 0x3e2aaaaa;
                      auVar58._20_4_ = 0x3e2aaaaa;
                      auVar58._24_4_ = 0x3e2aaaaa;
                      auVar58._28_4_ = 0x3e2aaaaa;
                      auVar103 = ZEXT1632(auVar169);
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar103,auVar58);
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar103,auVar150);
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar17,auVar103);
                      auVar104._0_4_ = auVar114._0_4_ + fVar53;
                      auVar104._4_4_ = auVar114._4_4_ + fVar197;
                      auVar104._8_4_ = auVar114._8_4_ + fVar198;
                      auVar104._12_4_ = auVar114._12_4_ + fVar2;
                      auVar104._16_4_ = fVar111 + 0.0;
                      auVar104._20_4_ = fVar14 + 0.0;
                      auVar104._24_4_ = fVar15 + 0.0;
                      auVar104._28_4_ = fVar16 + 0.0;
                      auVar113._0_4_ = (int)auVar81._0_4_;
                      auVar113._4_4_ = (int)auVar81._4_4_;
                      auVar113._8_4_ = (int)auVar81._8_4_;
                      auVar113._12_4_ = (int)auVar81._12_4_;
                      auVar118._16_4_ = (int)auVar81._16_4_;
                      auVar118._0_16_ = auVar113;
                      auVar118._20_4_ = (int)auVar81._20_4_;
                      auVar118._24_4_ = (int)auVar81._24_4_;
                      auVar118._28_4_ = (int)auVar81._28_4_;
                      auVar169 = vpslld_avx(auVar113,0x17);
                      auVar114 = vpslld_avx(auVar118._16_16_,0x17);
                      auVar152._8_4_ = 0x3f800000;
                      auVar152._0_8_ = 0x3f8000003f800000;
                      auVar152._12_4_ = 0x3f800000;
                      auVar114 = vpaddd_avx(auVar152,auVar114);
                      auVar169 = vpaddd_avx(auVar169,auVar152);
                      auVar194._16_16_ = auVar114;
                      auVar194._0_16_ = auVar169;
                      auVar70 = vfmadd213ps_fma(auVar194,auVar104,auVar64);
                      auVar59._8_4_ = 0x800000;
                      auVar59._0_8_ = 0x80000000800000;
                      auVar59._12_4_ = 0x800000;
                      auVar59._16_4_ = 0x800000;
                      auVar59._20_4_ = 0x800000;
                      auVar59._24_4_ = 0x800000;
                      auVar59._28_4_ = 0x800000;
                      auVar81 = vmaxps_avx(ZEXT1632(auVar70),auVar59);
                      auVar169 = vpsrld_avx(auVar81._0_16_,0x17);
                      auVar114 = vpsrld_avx(auVar81._16_16_,0x17);
                      auVar60._8_4_ = 0x807fffff;
                      auVar60._0_8_ = 0x807fffff807fffff;
                      auVar60._12_4_ = 0x807fffff;
                      auVar60._16_4_ = 0x807fffff;
                      auVar60._20_4_ = 0x807fffff;
                      auVar60._24_4_ = 0x807fffff;
                      auVar60._28_4_ = 0x807fffff;
                      auVar81 = vandps_avx(auVar81,auVar60);
                      auVar103 = vorps_avx(auVar81,auVar150);
                      auVar61._8_4_ = 0x3f3504f3;
                      auVar61._0_8_ = 0x3f3504f33f3504f3;
                      auVar61._12_4_ = 0x3f3504f3;
                      auVar61._16_4_ = 0x3f3504f3;
                      auVar61._20_4_ = 0x3f3504f3;
                      auVar61._24_4_ = 0x3f3504f3;
                      auVar61._28_4_ = 0x3f3504f3;
                      auVar17 = vcmpps_avx(auVar61,auVar103,2);
                      auVar81 = vandnps_avx(auVar17,auVar103);
                      auVar105._0_4_ = auVar81._0_4_ + auVar103._0_4_ + -1.0;
                      auVar105._4_4_ = auVar81._4_4_ + auVar103._4_4_ + -1.0;
                      auVar105._8_4_ = auVar81._8_4_ + auVar103._8_4_ + -1.0;
                      auVar105._12_4_ = auVar81._12_4_ + auVar103._12_4_ + -1.0;
                      auVar105._16_4_ = auVar81._16_4_ + auVar103._16_4_ + -1.0;
                      auVar105._20_4_ = auVar81._20_4_ + auVar103._20_4_ + -1.0;
                      auVar105._24_4_ = auVar81._24_4_ + auVar103._24_4_ + -1.0;
                      auVar105._28_4_ = auVar81._28_4_ + auVar103._28_4_ + -1.0;
                      auVar114 = vpsubd_avx(auVar114,auVar17._16_16_);
                      auVar177._8_4_ = 0xffffff81;
                      auVar177._0_8_ = 0xffffff81ffffff81;
                      auVar177._12_4_ = 0xffffff81;
                      auVar114 = vpaddd_avx(auVar114,auVar177);
                      auVar169 = vpsubd_avx(auVar169,auVar17._0_16_);
                      auVar169 = vpaddd_avx(auVar177,auVar169);
                      auVar119._16_16_ = auVar114;
                      auVar119._0_16_ = auVar169;
                      auVar81._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                      auVar81._0_4_ = auVar105._0_4_ * auVar105._0_4_;
                      auVar81._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                      auVar81._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                      auVar81._16_4_ = auVar105._16_4_ * auVar105._16_4_;
                      auVar81._20_4_ = auVar105._20_4_ * auVar105._20_4_;
                      auVar81._24_4_ = auVar105._24_4_ * auVar105._24_4_;
                      auVar81._28_4_ = auVar17._28_4_;
                      auVar175._8_4_ = 0x3d9021bb;
                      auVar175._0_8_ = 0x3d9021bb3d9021bb;
                      auVar175._12_4_ = 0x3d9021bb;
                      auVar175._16_4_ = 0x3d9021bb;
                      auVar175._20_4_ = 0x3d9021bb;
                      auVar175._24_4_ = 0x3d9021bb;
                      auVar175._28_4_ = 0x3d9021bb;
                      auVar159._8_4_ = 0xbdebd1b8;
                      auVar159._0_8_ = 0xbdebd1b8bdebd1b8;
                      auVar159._12_4_ = 0xbdebd1b8;
                      auVar159._16_4_ = 0xbdebd1b8;
                      auVar159._20_4_ = 0xbdebd1b8;
                      auVar159._24_4_ = 0xbdebd1b8;
                      auVar159._28_4_ = 0xbdebd1b8;
                      auVar114 = vfmadd213ps_fma(auVar175,auVar105,auVar159);
                      auVar160._8_4_ = 0x3def251a;
                      auVar160._0_8_ = 0x3def251a3def251a;
                      auVar160._12_4_ = 0x3def251a;
                      auVar160._16_4_ = 0x3def251a;
                      auVar160._20_4_ = 0x3def251a;
                      auVar160._24_4_ = 0x3def251a;
                      auVar160._28_4_ = 0x3def251a;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar105,auVar160);
                      auVar161._8_4_ = 0xbdfe5d4f;
                      auVar161._0_8_ = 0xbdfe5d4fbdfe5d4f;
                      auVar161._12_4_ = 0xbdfe5d4f;
                      auVar161._16_4_ = 0xbdfe5d4f;
                      auVar161._20_4_ = 0xbdfe5d4f;
                      auVar161._24_4_ = 0xbdfe5d4f;
                      auVar161._28_4_ = 0xbdfe5d4f;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar105,auVar161);
                      auVar162._8_4_ = 0x3e11e9bf;
                      auVar162._0_8_ = 0x3e11e9bf3e11e9bf;
                      auVar162._12_4_ = 0x3e11e9bf;
                      auVar162._16_4_ = 0x3e11e9bf;
                      auVar162._20_4_ = 0x3e11e9bf;
                      auVar162._24_4_ = 0x3e11e9bf;
                      auVar162._28_4_ = 0x3e11e9bf;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar105,auVar162);
                      auVar163._8_4_ = 0xbe2aae50;
                      auVar163._0_8_ = 0xbe2aae50be2aae50;
                      auVar163._12_4_ = 0xbe2aae50;
                      auVar163._16_4_ = 0xbe2aae50;
                      auVar163._20_4_ = 0xbe2aae50;
                      auVar163._24_4_ = 0xbe2aae50;
                      auVar163._28_4_ = 0xbe2aae50;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar105,auVar163);
                      auVar164._8_4_ = 0x3e4cceac;
                      auVar164._0_8_ = 0x3e4cceac3e4cceac;
                      auVar164._12_4_ = 0x3e4cceac;
                      auVar164._16_4_ = 0x3e4cceac;
                      auVar164._20_4_ = 0x3e4cceac;
                      auVar164._24_4_ = 0x3e4cceac;
                      auVar164._28_4_ = 0x3e4cceac;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar105,auVar164);
                      auVar165._8_4_ = 0xbe7ffffc;
                      auVar165._0_8_ = 0xbe7ffffcbe7ffffc;
                      auVar165._12_4_ = 0xbe7ffffc;
                      auVar165._16_4_ = 0xbe7ffffc;
                      auVar165._20_4_ = 0xbe7ffffc;
                      auVar165._24_4_ = 0xbe7ffffc;
                      auVar165._28_4_ = 0xbe7ffffc;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar105,auVar165);
                      auVar166._8_4_ = 0x3eaaaaaa;
                      auVar166._0_8_ = 0x3eaaaaaa3eaaaaaa;
                      auVar166._12_4_ = 0x3eaaaaaa;
                      auVar166._16_4_ = 0x3eaaaaaa;
                      auVar166._20_4_ = 0x3eaaaaaa;
                      auVar166._24_4_ = 0x3eaaaaaa;
                      auVar166._28_4_ = 0x3eaaaaaa;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar105,auVar166);
                      auVar176._0_4_ =
                           auVar105._0_4_ * auVar105._0_4_ * auVar105._0_4_ * auVar114._0_4_;
                      auVar176._4_4_ =
                           auVar105._4_4_ * auVar105._4_4_ * auVar105._4_4_ * auVar114._4_4_;
                      auVar176._8_4_ =
                           auVar105._8_4_ * auVar105._8_4_ * auVar105._8_4_ * auVar114._8_4_;
                      auVar176._12_4_ =
                           auVar105._12_4_ * auVar105._12_4_ * auVar105._12_4_ * auVar114._12_4_;
                      auVar176._16_4_ = auVar105._16_4_ * auVar105._16_4_ * auVar105._16_4_ * 0.0;
                      auVar176._20_4_ = auVar105._20_4_ * auVar105._20_4_ * auVar105._20_4_ * 0.0;
                      auVar176._24_4_ = auVar105._24_4_ * auVar105._24_4_ * auVar105._24_4_ * 0.0;
                      auVar176._28_4_ = 0;
                      auVar17 = vcvtdq2ps_avx(auVar119);
                      auVar182._8_4_ = 0xb95e8083;
                      auVar182._0_8_ = 0xb95e8083b95e8083;
                      auVar182._12_4_ = 0xb95e8083;
                      auVar182._16_4_ = 0xb95e8083;
                      auVar182._20_4_ = 0xb95e8083;
                      auVar182._24_4_ = 0xb95e8083;
                      auVar182._28_4_ = 0xb95e8083;
                      auVar114 = vfmadd231ps_fma(auVar176,auVar17,auVar182);
                      auVar114 = vfmsub231ps_fma(ZEXT1632(auVar114),auVar150,auVar81);
                      auVar81 = vcmpps_avx(ZEXT1632(auVar70),ZEXT832(0) << 0x20,2);
                      auVar103 = vsubps_avx(ZEXT1632(auVar114),auVar105);
                      auVar114 = vfmsub231ps_fma(auVar103,auVar151,auVar17);
                      auVar167._8_4_ = 0xc0000000;
                      auVar167._0_8_ = 0xc0000000c0000000;
                      auVar167._12_4_ = 0xc0000000;
                      auVar167._16_4_ = 0xc0000000;
                      auVar167._20_4_ = 0xc0000000;
                      auVar167._24_4_ = 0xc0000000;
                      auVar167._28_4_ = 0xc0000000;
                      auVar106._0_4_ = auVar114._0_4_ * -2.0;
                      auVar106._4_4_ = auVar114._4_4_ * -2.0;
                      auVar106._8_4_ = auVar114._8_4_ * -2.0;
                      auVar106._12_4_ = auVar114._12_4_ * -2.0;
                      auVar106._16_4_ = 0x80000000;
                      auVar106._20_4_ = 0x80000000;
                      auVar106._24_4_ = 0x80000000;
                      auVar106._28_4_ = 0;
                      auVar120._8_4_ = 0x7fffffff;
                      auVar120._0_8_ = 0x7fffffff7fffffff;
                      auVar120._12_4_ = 0x7fffffff;
                      auVar120._16_4_ = 0x7fffffff;
                      auVar120._20_4_ = 0x7fffffff;
                      auVar120._24_4_ = 0x7fffffff;
                      auVar120._28_4_ = 0x7fffffff;
                      auVar81 = vblendvps_avx(auVar106,auVar120,auVar81);
                      auVar81 = vminps_avx(auVar181,auVar81);
                      auVar184 = ZEXT3264(auVar77);
                      auVar77 = vmaxps_avx(auVar77,auVar81);
                      auVar186 = ZEXT3264(auVar126);
                      auVar114 = vfmadd213ps_fma(auVar126,auVar77,auVar150);
                      auVar126 = vroundps_avx(ZEXT1632(auVar114),1);
                      auVar81 = vcmpps_avx(ZEXT1632(auVar114),auVar126,1);
                      auVar81 = vandps_avx(auVar81,auVar64);
                      auVar81 = vsubps_avx(auVar126,auVar81);
                      auVar114 = vfmsub231ps_fma(auVar77,auVar81,auVar151);
                      auVar169 = vfnmsub231ps_fma(ZEXT1632(auVar114),auVar81,auVar182);
                      auVar77 = ZEXT1632(auVar169);
                      auVar103._28_4_ = auVar126._28_4_;
                      auVar103._0_28_ =
                           ZEXT1628(CONCAT412(auVar169._12_4_ * auVar169._12_4_,
                                              CONCAT48(auVar169._8_4_ * auVar169._8_4_,
                                                       CONCAT44(auVar169._4_4_ * auVar169._4_4_,
                                                                auVar169._0_4_ * auVar169._0_4_))));
                      auVar189 = ZEXT3264(auVar62);
                      auVar114 = vfmadd213ps_fma(auVar62,auVar77,auVar188);
                      auVar195._8_4_ = 0x3c088908;
                      auVar195._0_8_ = 0x3c0889083c088908;
                      auVar195._12_4_ = 0x3c088908;
                      auVar195._16_4_ = 0x3c088908;
                      auVar195._20_4_ = 0x3c088908;
                      auVar195._24_4_ = 0x3c088908;
                      auVar195._28_4_ = 0x3c088908;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar77,auVar195);
                      auVar62._8_4_ = 0x3d2aa9c1;
                      auVar62._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar62._12_4_ = 0x3d2aa9c1;
                      auVar62._16_4_ = 0x3d2aa9c1;
                      auVar62._20_4_ = 0x3d2aa9c1;
                      auVar62._24_4_ = 0x3d2aa9c1;
                      auVar62._28_4_ = 0x3d2aa9c1;
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar77,auVar62);
                      auVar63._8_4_ = 0x3e2aaaaa;
                      auVar63._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar63._12_4_ = 0x3e2aaaaa;
                      auVar63._16_4_ = 0x3e2aaaaa;
                      auVar63._20_4_ = 0x3e2aaaaa;
                      auVar63._24_4_ = 0x3e2aaaaa;
                      auVar63._28_4_ = 0x3e2aaaaa;
                      auVar77 = ZEXT1632(auVar169);
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar77,auVar63);
                      auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar77,auVar150);
                      auVar70 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar103,auVar77);
                      auVar147 = ZEXT3264(auVar64);
                      auVar84._0_4_ = (int)auVar81._0_4_;
                      auVar84._4_4_ = (int)auVar81._4_4_;
                      auVar84._8_4_ = (int)auVar81._8_4_;
                      auVar84._12_4_ = (int)auVar81._12_4_;
                      auVar107._16_4_ = (int)auVar81._16_4_;
                      auVar107._0_16_ = auVar84;
                      auVar107._20_4_ = (int)auVar81._20_4_;
                      auVar107._24_4_ = (int)auVar81._24_4_;
                      auVar107._28_4_ = (int)auVar81._28_4_;
                      auVar169 = vpslld_avx(auVar84,0x17);
                      auVar114 = vpslld_avx(auVar107._16_16_,0x17);
                      auVar128._8_4_ = 0x3f800000;
                      auVar128._0_8_ = 0x3f8000003f800000;
                      auVar128._12_4_ = 0x3f800000;
                      auVar114 = vpaddd_avx(auVar114,auVar128);
                      auVar169 = vpaddd_avx(auVar169,auVar128);
                      auVar108._16_16_ = auVar114;
                      auVar108._0_16_ = auVar169;
                      auVar121._0_4_ = auVar70._0_4_ + fVar53;
                      auVar121._4_4_ = auVar70._4_4_ + fVar197;
                      auVar121._8_4_ = auVar70._8_4_ + fVar198;
                      auVar121._12_4_ = auVar70._12_4_ + fVar2;
                      auVar121._16_4_ = fVar111 + 0.0;
                      auVar121._20_4_ = fVar14 + 0.0;
                      auVar121._24_4_ = fVar15 + 0.0;
                      auVar121._28_4_ = fVar16 + 0.0;
                      auVar114 = vfmadd213ps_fma(auVar108,auVar121,auVar64);
                      auVar81 = vrcpps_avx(ZEXT1632(auVar114));
                      auVar114 = vfmsub213ps_fma(ZEXT1632(auVar114),auVar81,auVar64);
                      auVar114 = vfnmadd132ps_fma(ZEXT1632(auVar114),auVar81,auVar81);
                      auVar64._8_4_ = 0xbf800000;
                      auVar64._0_8_ = 0xbf800000bf800000;
                      auVar64._12_4_ = 0xbf800000;
                      auVar64._16_4_ = 0xbf800000;
                      auVar64._20_4_ = 0xbf800000;
                      auVar64._24_4_ = 0xbf800000;
                      auVar64._28_4_ = 0xbf800000;
                      auVar114 = vfnmadd213ps_fma(ZEXT1632(auVar114),auVar167,auVar64);
                      auVar102 = ZEXT1628(auVar114);
                      goto LAB_00453ac3;
                    case 6:
                      uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var36);
                      auVar77._4_4_ = uVar1;
                      auVar77._0_4_ = uVar1;
                      auVar77._8_4_ = uVar1;
                      auVar77._12_4_ = uVar1;
                      auVar77._16_4_ = uVar1;
                      auVar77._20_4_ = uVar1;
                      auVar77._24_4_ = uVar1;
                      auVar77._28_4_ = uVar1;
                      uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var36))[1];
                      auVar126._4_4_ = uVar1;
                      auVar126._0_4_ = uVar1;
                      auVar126._8_4_ = uVar1;
                      auVar126._12_4_ = uVar1;
                      auVar126._16_4_ = uVar1;
                      auVar126._20_4_ = uVar1;
                      auVar126._24_4_ = uVar1;
                      auVar126._28_4_ = uVar1;
                      auVar114 = vfmadd231ps_fma(auVar126,auVar81,auVar77);
                      auVar81 = vmaxps_avx(ZEXT1632(auVar114),_DAT_005970e0);
                      auVar81 = vminps_avx(auVar81,auVar64);
                      auVar102 = auVar81._0_28_;
LAB_00453ac3:
                      auVar83._0_4_ = auVar102._0_4_ * auVar82._0_4_;
                      auVar83._4_4_ = auVar102._4_4_ * auVar82._4_4_;
                      auVar83._8_4_ = auVar102._8_4_ * auVar82._8_4_;
                      auVar83._12_4_ = auVar102._12_4_ * auVar82._12_4_;
                      auVar83._16_4_ = auVar102._16_4_ * auVar82._16_4_;
                      auVar83._20_4_ = auVar102._20_4_ * auVar82._20_4_;
                      auVar83._24_4_ = auVar102._24_4_ * auVar82._24_4_;
                      auVar81 = auVar83._0_32_;
                    }
                    *pauVar46 = auVar81;
                    pauVar46 = pauVar46 + 1;
                    iVar42 = iVar42 + 1;
                    local_2c8 = local_2c8 + 1;
                  } while (iVar42 != iVar51);
                }
                iVar34 = iVar34 + 1;
              } while (iVar34 != iVar41);
            }
            local_2e0 = local_2e0 + 1;
          } while (local_2e0 != uVar37);
        }
      }
    }
    else {
      uVar30 = (int)(uVar30 * iVar44) / iVar9;
      local_238._0_4_ = *(int *)(&this->field_0xd0 + (long)p_Var36) / iVar9;
      local_2b8 = 1;
      local_2a8 = 1;
      if (opt->use_packing_layout == true) {
        local_2b8 = (uint)((uVar30 & 3) == 0) * 3 + 1;
        if ((uVar30 & 7) == 0) {
          local_2b8 = 8;
        }
        local_2a8 = (uint)(((uint)local_238 & 3) == 0) * 3 + 1;
        if (((uint)local_238 & 7) == 0) {
          local_2a8 = 8;
        }
      }
      piVar11 = bottom_blob->refcount;
      local_1a8._0_8_ = bottom_blob->data;
      local_1a8._8_4_ = SUB84(bottom_blob->refcount,0);
      local_1a8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
      local_1a8._16_8_ = bottom_blob->elemsize;
      local_1a8._24_4_ = bottom_blob->elempack;
      local_1a8._32_8_ = bottom_blob->allocator;
      local_180._0_4_ = bottom_blob->dims;
      local_180._4_4_ = bottom_blob->w;
      local_180._8_4_ = bottom_blob->h;
      local_180._12_4_ = bottom_blob->d;
      local_170 = bottom_blob->c;
      local_168 = bottom_blob->cstep;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      if (local_2b8 < iVar44) {
        local_1f8._0_8_ = *(undefined8 *)opt;
        local_1f8._16_8_ = opt->workspace_allocator;
        uVar19 = opt->openmp_blocktime;
        uVar20 = opt->use_winograd_convolution;
        uVar22 = opt->use_sgemm_convolution;
        uVar24 = opt->use_int8_inference;
        uVar26 = opt->use_vulkan_compute;
        uVar25 = CONCAT11(uVar26,uVar24);
        uVar23 = CONCAT21(uVar25,uVar22);
        uVar21 = CONCAT31(uVar23,uVar20);
        local_1f8._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
        auStack_1d0[0] = opt->use_shader_pack8;
        auStack_1d0[1] = opt->use_subgroup_basic;
        auStack_1d0[2] = opt->use_subgroup_vote;
        auStack_1d0[3] = opt->use_subgroup_ballot;
        auStack_1d0[4] = opt->use_subgroup_shuffle;
        auStack_1d0[5] = opt->use_image_storage;
        auStack_1d0[6] = opt->use_tensor_storage;
        auStack_1d0[7] = opt->use_reserved_0;
        auStack_1d0._8_4_ = opt->flush_denormals;
        auStack_1d0[0xc] = opt->use_local_pool_allocator;
        auStack_1d0[0xd] = opt->use_shader_local_memory;
        auStack_1d0[0xe] = opt->use_cooperative_matrix;
        auStack_1d0[0xf] = opt->use_winograd23_convolution;
        uStack_1c0._0_1_ = opt->use_winograd43_convolution;
        uStack_1c0._1_1_ = opt->use_winograd63_convolution;
        uStack_1c0._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_1c0._3_1_ = opt->use_reserved_7;
        uStack_1c0._4_1_ = opt->use_reserved_8;
        uStack_1c0._5_1_ = opt->use_reserved_9;
        uStack_1c0._6_1_ = opt->use_reserved_10;
        uStack_1c0._7_1_ = opt->use_reserved_11;
        local_1f8._8_4_ = SUB84(opt->workspace_allocator,0);
        local_1f8._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        local_1f8._24_4_ = uVar19;
        local_1f8._28_4_ = uVar21;
        convert_packing(bottom_blob,(Mat *)local_1a8,local_2b8,(Option *)local_1f8);
      }
      piVar11 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      local_1f8._0_8_ = local_288.data;
      local_1f8._8_4_ = local_288.refcount._0_4_;
      local_1f8._12_4_ = local_288.refcount._4_4_;
      local_1f8._16_8_ = local_288.elemsize;
      local_1f8._24_4_ = local_288.elempack;
      local_1f8._32_8_ = local_288.allocator;
      auStack_1d0._4_4_ = local_288.w;
      auStack_1d0._0_4_ = local_288.dims;
      auStack_1d0._8_4_ = local_288.h;
      auStack_1d0._12_4_ = local_288.d;
      uStack_1c0 = CONCAT44(uStack_1c0._4_4_,local_288.c);
      local_1b8 = local_288.cstep;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      if ((local_2a8 < uVar29) &&
         ((Mat::create((Mat *)local_1f8,iVar51,iVar41,
                       *(int *)(&this->field_0xd0 +
                               (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3]) /
                       (int)local_2a8,(ulong)local_2a8 * (sVar43 / uVar29),local_2a8,
                       opt->workspace_allocator), (void *)local_1f8._0_8_ == (void *)0x0 ||
          ((long)(int)uStack_1c0 * local_1b8 == 0)))) {
        piVar11 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
        iVar44 = -100;
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
              if ((void *)local_1f8._0_8_ != (void *)0x0) {
                free((void *)local_1f8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_1f8._32_8_)[3])();
            }
          }
        }
        local_1b8 = 0;
        local_1f8._0_8_ = (void *)0x0;
        local_1f8._8_4_ = 0;
        local_1f8._12_4_ = 0;
        local_1f8._16_8_ = (Allocator *)0x0;
        local_1f8._24_4_ = 0;
        auStack_1d0 = (undefined1  [16])0x0;
        uStack_1c0 = uStack_1c0 & 0xffffffff00000000;
        piVar11 = (int *)CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if ((Allocator *)local_1a8._32_8_ == (Allocator *)0x0) {
              if ((void *)local_1a8._0_8_ != (void *)0x0) {
                free((void *)local_1a8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_1a8._32_8_)[3])();
            }
          }
        }
        local_168 = 0;
        local_1a8._0_8_ = (void *)0x0;
        local_1a8._8_4_ = 0;
        local_1a8._12_4_ = 0;
        local_1a8._16_8_ = 0;
        local_1a8._24_4_ = 0;
        local_180 = (undefined1  [16])0x0;
        local_170 = 0;
        goto LAB_00454ed5;
      }
      if (0 < *(int *)(&this->field_0x114 + (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3])) {
        iVar41 = (int)(uint)local_238 / (int)local_2a8;
        iVar51 = 0;
        iVar44 = 0;
        lVar38 = 0;
        do {
          local_d8 = (void *)((long)(iVar51 / local_2b8) * local_168 * local_1a8._16_8_ +
                             local_1a8._0_8_);
          uStack_d0 = 0;
          uStack_cc = 0;
          local_c8 = local_1a8._16_8_;
          local_c0 = local_1a8._24_4_;
          local_b8 = (Allocator *)local_1a8._32_8_;
          local_98 = ((long)(int)local_180._12_4_ * local_1a8._16_8_ *
                      (long)(int)local_180._8_4_ * (long)(int)local_180._4_4_ + 0xfU &
                     0xfffffffffffffff0) / (ulong)local_1a8._16_8_;
          local_b0 = local_180;
          local_128 = (void *)((long)(iVar44 / (int)local_2a8) * local_1b8 * local_1f8._16_8_ +
                              local_1f8._0_8_);
          uStack_120 = 0;
          uStack_11c = 0;
          local_118 = (Allocator *)local_1f8._16_8_;
          local_110 = local_1f8._24_4_;
          local_108 = (Allocator *)local_1f8._32_8_;
          local_e8 = ((long)(int)auStack_1d0._12_4_ * local_1f8._16_8_ *
                      (long)(int)auStack_1d0._8_4_ * (long)(int)auStack_1d0._4_4_ + 0xfU &
                     0xfffffffffffffff0) / (ulong)local_1f8._16_8_;
          local_100 = auStack_1d0;
          pLVar13 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar38];
          local_78._0_1_ = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78._4_4_ = opt->num_threads;
          pAStack_68 = opt->workspace_allocator;
          uStack_60._0_4_ = opt->openmp_blocktime;
          uStack_60._4_1_ = opt->use_winograd_convolution;
          uStack_60._5_1_ = opt->use_sgemm_convolution;
          uStack_60._6_1_ = opt->use_int8_inference;
          uStack_60._7_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_shader_local_memory;
          uStack_48._6_1_ = opt->use_cooperative_matrix;
          uStack_48._7_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          pAStack_70 = (Allocator *)local_1f8._32_8_;
          local_f0 = iVar41;
          local_a0 = (int)uVar30 / local_2b8;
          (*pLVar13->_vptr_Layer[7])(pLVar13,&local_d8,&local_128,&local_78);
          piVar11 = (int *)CONCAT44(uStack_11c,uStack_120);
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              if (local_108 == (Allocator *)0x0) {
                if (local_128 != (void *)0x0) {
                  free(local_128);
                }
              }
              else {
                (*local_108->_vptr_Allocator[3])();
              }
            }
          }
          local_e8 = 0;
          local_128 = (void *)0x0;
          uStack_120 = 0;
          uStack_11c = 0;
          local_118 = (Allocator *)0x0;
          local_110 = 0;
          local_100 = (undefined1  [16])0x0;
          local_f0 = 0;
          piVar11 = (int *)CONCAT44(uStack_cc,uStack_d0);
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              if (local_b8 == (Allocator *)0x0) {
                if (local_d8 != (void *)0x0) {
                  free(local_d8);
                }
              }
              else {
                (*local_b8->_vptr_Allocator[3])();
              }
            }
          }
          local_98 = 0;
          local_d8 = (void *)0x0;
          uStack_d0 = 0;
          uStack_cc = 0;
          local_c8 = 0;
          local_c0 = 0;
          local_b0 = (undefined1  [16])0x0;
          local_a0 = 0;
          lVar38 = lVar38 + 1;
          iVar44 = iVar44 + (uint)local_238;
          iVar51 = iVar51 + uVar30;
        } while (lVar38 < *(int *)(&this->field_0x114 +
                                  (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3]));
      }
      if (local_2a8 < uVar29) {
        convert_packing((Mat *)local_1f8,&local_288,uVar29,opt);
      }
      else {
        piVar11 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + 1;
          UNLOCK();
        }
        piVar11 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (local_288.allocator == (Allocator *)0x0) {
              if (local_288.data != (void *)0x0) {
                free(local_288.data);
              }
            }
            else {
              (*(local_288.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        auVar114 = auStack_1d0;
        local_288.data = (void *)local_1f8._0_8_;
        local_288.refcount._0_4_ = local_1f8._8_4_;
        local_288.refcount._4_4_ = local_1f8._12_4_;
        local_288.elemsize = local_1f8._16_8_;
        local_288.elempack = local_1f8._24_4_;
        local_288.allocator = (Allocator *)local_1f8._32_8_;
        local_288.dims = auStack_1d0._0_4_;
        local_288.w = auStack_1d0._4_4_;
        local_288.h = auStack_1d0._8_4_;
        local_288.d = auStack_1d0._12_4_;
        local_288.c = (int)uStack_1c0;
        local_288.cstep = local_1b8;
        auStack_1d0 = auVar114;
      }
      piVar11 = (int *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_1f8._0_8_ != (void *)0x0) {
              free((void *)local_1f8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_1f8._32_8_)[3])();
          }
        }
      }
      local_1b8 = 0;
      local_1f8._0_8_ = (void *)0x0;
      local_1f8._8_4_ = 0;
      local_1f8._12_4_ = 0;
      local_1f8._16_8_ = (Allocator *)0x0;
      local_1f8._24_4_ = 0;
      auStack_1d0 = (undefined1  [16])0x0;
      uStack_1c0 = uStack_1c0 & 0xffffffff00000000;
      piVar11 = (int *)CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if ((Allocator *)local_1a8._32_8_ == (Allocator *)0x0) {
            if ((void *)local_1a8._0_8_ != (void *)0x0) {
              free((void *)local_1a8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_1a8._32_8_)[3])();
          }
        }
      }
      local_168 = 0;
      local_1a8._0_8_ = (void *)0x0;
      local_1a8._8_4_ = 0;
      local_1a8._12_4_ = 0;
      local_1a8._16_8_ = 0;
      local_1a8._24_4_ = 0;
      local_180 = (undefined1  [16])0x0;
      local_170 = 0;
    }
    pMVar27 = local_150;
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86_fma +
               (long)this->_vptr_DeconvolutionDepthWise_x86_fma[-3]),&local_288,local_150,opt);
    iVar44 = -100;
    if ((pMVar27->data != (void *)0x0) && (iVar44 = -100, (long)pMVar27->c * pMVar27->cstep != 0)) {
      iVar44 = 0;
    }
  }
LAB_00454ed5:
  piVar11 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar44;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}